

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_deep_copy(REF_ADAPT *ref_adapt_ptr,REF_ADAPT original)

{
  REF_ADAPT pRVar1;
  REF_ADAPT ref_adapt;
  REF_ADAPT original_local;
  REF_ADAPT *ref_adapt_ptr_local;
  
  pRVar1 = (REF_ADAPT)malloc(0x88);
  *ref_adapt_ptr = pRVar1;
  if (*ref_adapt_ptr == (REF_ADAPT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x54,
           "ref_adapt_deep_copy","malloc *ref_adapt_ptr of REF_ADAPT_STRUCT NULL");
    ref_adapt_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_adapt_ptr;
    pRVar1->split_ratio_growth = original->split_ratio_growth;
    pRVar1->split_ratio = original->split_ratio;
    pRVar1->split_quality_absolute = original->split_quality_absolute;
    pRVar1->split_quality_relative = original->split_quality_relative;
    pRVar1->collapse_ratio = original->collapse_ratio;
    pRVar1->collapse_quality_absolute = original->collapse_quality_absolute;
    pRVar1->smooth_min_quality = original->smooth_min_quality;
    pRVar1->smooth_pliant_alpha = original->smooth_pliant_alpha;
    pRVar1->swap_max_degree = original->swap_max_degree;
    pRVar1->swap_min_quality = original->swap_min_quality;
    pRVar1->post_min_normdev = original->post_min_normdev;
    pRVar1->post_min_ratio = original->post_min_ratio;
    pRVar1->post_max_ratio = original->post_max_ratio;
    pRVar1->last_min_ratio = original->last_min_ratio;
    pRVar1->last_max_ratio = original->last_max_ratio;
    pRVar1->unlock_tet = original->unlock_tet;
    pRVar1->timing_level = original->timing_level;
    pRVar1->watch_param = original->watch_param;
    pRVar1->watch_topo = original->watch_topo;
    ref_adapt_ptr_local._4_4_ = 0;
  }
  return ref_adapt_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_deep_copy(REF_ADAPT *ref_adapt_ptr,
                                       REF_ADAPT original) {
  REF_ADAPT ref_adapt;

  ref_malloc(*ref_adapt_ptr, 1, REF_ADAPT_STRUCT);

  ref_adapt = *ref_adapt_ptr;

  ref_adapt->split_ratio_growth = original->split_ratio_growth;
  ref_adapt->split_ratio = original->split_ratio;
  ref_adapt->split_quality_absolute = original->split_quality_absolute;
  ref_adapt->split_quality_relative = original->split_quality_relative;

  ref_adapt->collapse_ratio = original->collapse_ratio;
  ref_adapt->collapse_quality_absolute = original->collapse_quality_absolute;

  ref_adapt->smooth_min_quality = original->smooth_min_quality;
  ref_adapt->smooth_pliant_alpha = original->smooth_pliant_alpha;

  ref_adapt->swap_max_degree = original->swap_max_degree;
  ref_adapt->swap_min_quality = original->swap_min_quality;

  ref_adapt->post_min_normdev = original->post_min_normdev;
  ref_adapt->post_min_ratio = original->post_min_ratio;
  ref_adapt->post_max_ratio = original->post_max_ratio;

  ref_adapt->last_min_ratio = original->last_min_ratio;
  ref_adapt->last_max_ratio = original->last_max_ratio;

  ref_adapt->unlock_tet = original->unlock_tet;

  ref_adapt->timing_level = original->timing_level;
  ref_adapt->watch_param = original->watch_param;
  ref_adapt->watch_topo = original->watch_topo;

  return REF_SUCCESS;
}